

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::ShaderMatrixInstance::ShaderMatrixInstance
          (ShaderMatrixInstance *this,Context *context,bool isVertex,ShaderEvaluator *evaluator,
          ShaderInput in0,ShaderInput in1,MatrixOp op)

{
  bool bVar1;
  uint uVar2;
  TestMatrixType TVar3;
  int iVar4;
  BaseAttributeType type;
  reference pvVar5;
  float *pfVar6;
  float fVar7;
  ShaderInput *local_1a8;
  bool local_c9;
  ShaderInput *in;
  int inNdx;
  int numInputs;
  int col;
  int row;
  int attribNdx_1;
  int local_68;
  int attribNdx;
  UniformSetup local_58;
  ShaderEvaluator *local_48;
  ShaderEvaluator *evaluator_local;
  Context *pCStack_38;
  bool isVertex_local;
  Context *context_local;
  ShaderMatrixInstance *this_local;
  InputType local_1c;
  undefined8 local_14;
  ShaderInput in0_local;
  
  local_1c = in0.precision;
  register0x00000080 = in0._0_8_;
  local_48 = evaluator;
  evaluator_local._7_1_ = isVertex;
  pCStack_38 = context;
  context_local = (Context *)this;
  local_14 = register0x00000080;
  in0_local.inputType = local_1c;
  UniformSetup::UniformSetup(&local_58,(UniformSetupFunc)0x0);
  local_c9 = (evaluator_local._7_1_ & 1) != 0 && op == OP_INVERSE;
  ShaderRenderCaseInstance::ShaderRenderCaseInstance
            (&this->super_ShaderRenderCaseInstance,context,isVertex,evaluator,&local_58,
             (AttributeSetupFunc)0x0,IMAGE_BACKING_MODE_REGULAR,(uint)local_c9 << 6);
  UniformSetup::~UniformSetup(&local_58);
  (this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__ShaderMatrixInstance_016a8848;
  (this->m_in0).precision = in0_local.inputType;
  (this->m_in0).inputType = (undefined4)local_14;
  (this->m_in0).dataType = local_14._4_4_;
  (this->m_in1).precision = in1.precision;
  (this->m_in1).inputType = in1.inputType;
  (this->m_in1).dataType = in1.dataType;
  this->m_op = op;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
            (&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,4);
  for (local_68 = 0; local_68 < 4; local_68 = local_68 + 1) {
    row = 0;
    tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)&attribNdx_1,(float *)&row);
    pvVar5 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
             operator[](&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,
                        (long)local_68);
    tcu::Matrix<float,_4,_4>::operator=(pvVar5,(Matrix<float,_4,_4> *)&attribNdx_1);
    tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)&attribNdx_1);
    pvVar5 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
             operator[](&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,
                        (long)local_68);
    pfVar6 = tcu::Matrix<float,_4,_4>::operator()(pvVar5,0,3);
    *pfVar6 = 0.2;
    pvVar5 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
             operator[](&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,
                        (long)local_68);
    pfVar6 = tcu::Matrix<float,_4,_4>::operator()(pvVar5,1,3);
    *pfVar6 = 0.1;
    fVar7 = (float)local_68;
    pvVar5 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
             operator[](&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,
                        (long)local_68);
    pfVar6 = tcu::Matrix<float,_4,_4>::operator()(pvVar5,2,3);
    *pfVar6 = fVar7 * 0.15 + 0.4;
    pvVar5 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
             operator[](&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,
                        (long)local_68);
    pfVar6 = tcu::Matrix<float,_4,_4>::operator()(pvVar5,3,3);
    *pfVar6 = 0.7;
    pvVar5 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
             operator[](&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,
                        (long)local_68);
    pfVar6 = tcu::Matrix<float,_4,_4>::operator()(pvVar5,local_68 % 4,0);
    *pfVar6 = 1.0;
    pvVar5 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
             operator[](&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,
                        (long)local_68);
    uVar2 = local_68 + 1U;
    if ((int)(local_68 + 1U) < 0) {
      uVar2 = local_68 + 4;
    }
    pfVar6 = tcu::Matrix<float,_4,_4>::operator()(pvVar5,(local_68 + 1) - (uVar2 & 0xfffffffc),1);
    *pfVar6 = 1.0;
    pvVar5 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
             operator[](&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,
                        (long)local_68);
    uVar2 = local_68 + 2U;
    if ((int)(local_68 + 2U) < 0) {
      uVar2 = local_68 + 5;
    }
    pfVar6 = tcu::Matrix<float,_4,_4>::operator()(pvVar5,(local_68 + 2) - (uVar2 & 0xfffffffc),2);
    *pfVar6 = 1.0;
    pvVar5 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
             operator[](&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,
                        (long)local_68);
    uVar2 = local_68 + 3U;
    if ((int)(local_68 + 3U) < 0) {
      uVar2 = local_68 + 6;
    }
    pfVar6 = tcu::Matrix<float,_4,_4>::operator()(pvVar5,(local_68 + 3) - (uVar2 & 0xfffffffc),3);
    *pfVar6 = 1.0;
  }
  TVar3 = MatrixCaseUtils::getOperationTestMatrixType(this->m_op);
  if (TVar3 != TESTMATRIXTYPE_DEFAULT) {
    for (col = 0; col < 4; col = col + 1) {
      for (numInputs = 0; numInputs < 4; numInputs = numInputs + 1) {
        for (inNdx = 0; inNdx < 4; inNdx = inNdx + 1) {
          TVar3 = MatrixCaseUtils::getOperationTestMatrixType(this->m_op);
          switch(TVar3) {
          case TESTMATRIXTYPE_NEGATED:
            pvVar5 = std::
                     vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                     operator[](&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,
                                (long)col);
            pfVar6 = tcu::Matrix<float,_4,_4>::operator()(pvVar5,numInputs,inNdx);
            fVar7 = *pfVar6;
            pvVar5 = std::
                     vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                     operator[](&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,
                                (long)col);
            pfVar6 = tcu::Matrix<float,_4,_4>::operator()(pvVar5,numInputs,inNdx);
            *pfVar6 = -fVar7;
            break;
          case TESTMATRIXTYPE_INCREMENTED:
            pvVar5 = std::
                     vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                     operator[](&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,
                                (long)col);
            pfVar6 = tcu::Matrix<float,_4,_4>::operator()(pvVar5,numInputs,inNdx);
            *pfVar6 = *pfVar6 + 0.3;
            break;
          case TESTMATRIXTYPE_DECREMENTED:
            pvVar5 = std::
                     vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                     operator[](&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,
                                (long)col);
            pfVar6 = tcu::Matrix<float,_4,_4>::operator()(pvVar5,numInputs,inNdx);
            *pfVar6 = *pfVar6 - 0.3;
            break;
          case TESTMATRIXTYPE_NEGATED_INCREMENTED:
            pvVar5 = std::
                     vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                     operator[](&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,
                                (long)col);
            pfVar6 = tcu::Matrix<float,_4,_4>::operator()(pvVar5,numInputs,inNdx);
            fVar7 = *pfVar6;
            pvVar5 = std::
                     vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                     operator[](&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,
                                (long)col);
            pfVar6 = tcu::Matrix<float,_4,_4>::operator()(pvVar5,numInputs,inNdx);
            *pfVar6 = 0.3 - fVar7;
            break;
          case TESTMATRIXTYPE_INCREMENTED_LESS:
            pvVar5 = std::
                     vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                     operator[](&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,
                                (long)col);
            pfVar6 = tcu::Matrix<float,_4,_4>::operator()(pvVar5,numInputs,inNdx);
            *pfVar6 = *pfVar6 - 0.1;
          }
        }
      }
    }
  }
  bVar1 = MatrixCaseUtils::isOperationBinary(this->m_op);
  iVar4 = 1;
  if (bVar1) {
    iVar4 = 2;
  }
  for (in._0_4_ = 0; (int)in < iVar4; in._0_4_ = (int)in + 1) {
    if ((int)in < 1) {
      local_1a8 = &this->m_in0;
    }
    else {
      local_1a8 = &this->m_in1;
    }
    if ((local_1a8->inputType == INPUTTYPE_DYNAMIC) &&
       (bVar1 = glu::isDataTypeMatrix(local_1a8->dataType), bVar1)) {
      type = getAttributeType(local_1a8->dataType);
      ShaderRenderCaseInstance::useAttribute(&this->super_ShaderRenderCaseInstance,(int)in + 4,type)
      ;
    }
  }
  return;
}

Assistant:

ShaderMatrixInstance::ShaderMatrixInstance (Context&				context,
											bool					isVertex,
											const ShaderEvaluator&	evaluator,
											const ShaderInput		in0,
											const ShaderInput		in1,
											const MatrixOp			op)
	: ShaderRenderCaseInstance	(context, isVertex, evaluator, DE_NULL, DE_NULL, IMAGE_BACKING_MODE_REGULAR, isVertex && op == OP_INVERSE ? 64 : GRID_SIZE_DEFAULTS)
	, m_in0						(in0)
	, m_in1						(in1)
	, m_op						(op)
{
	m_userAttribTransforms.resize(4);
	for (int attribNdx = 0; attribNdx < 4; attribNdx++)
	{
		m_userAttribTransforms[attribNdx] = Mat4(0.0f);
		m_userAttribTransforms[attribNdx](                  0, 3) = 0.2f;								// !< prevent matrix*vec from going into zero (assuming vec.w != 0)
		m_userAttribTransforms[attribNdx](                  1, 3) = 0.1f;								// !<
		m_userAttribTransforms[attribNdx](                  2, 3) = 0.4f + 0.15f * float(attribNdx);	// !<
		m_userAttribTransforms[attribNdx](                  3, 3) = 0.7f;								// !<
		m_userAttribTransforms[attribNdx]((0 + attribNdx) % 4, 0) = 1.0f;
		m_userAttribTransforms[attribNdx]((1 + attribNdx) % 4, 1) = 1.0f;
		m_userAttribTransforms[attribNdx]((2 + attribNdx) % 4, 2) = 1.0f;
		m_userAttribTransforms[attribNdx]((3 + attribNdx) % 4, 3) = 1.0f;
	}

	// prevent bad reference cases such as black result images by fine-tuning used matrices
	if (getOperationTestMatrixType(m_op) != TESTMATRIXTYPE_DEFAULT)
	{
		for (int attribNdx = 0; attribNdx < 4; attribNdx++)
		{
			for (int row = 0; row < 4; row++)
			for (int col = 0; col < 4; col++)
			{
				switch (getOperationTestMatrixType(m_op))
				{
					case TESTMATRIXTYPE_NEGATED:
						m_userAttribTransforms[attribNdx](row, col) = -m_userAttribTransforms[attribNdx](row, col);
						break;
					case TESTMATRIXTYPE_INCREMENTED:
						m_userAttribTransforms[attribNdx](row, col) += 0.3f;
						break;
					case TESTMATRIXTYPE_DECREMENTED:
						m_userAttribTransforms[attribNdx](row, col) -= 0.3f;
						break;
					case TESTMATRIXTYPE_NEGATED_INCREMENTED:
						m_userAttribTransforms[attribNdx](row, col) = -m_userAttribTransforms[attribNdx](row, col) + 0.3f;
						break;
					case TESTMATRIXTYPE_INCREMENTED_LESS:
						m_userAttribTransforms[attribNdx](row, col) -= 0.1f;
						break;

					default:
						DE_ASSERT(DE_FALSE);
						break;
				}
			}
		}
	}

	int	numInputs = isOperationBinary(m_op) ? 2 : 1;

	for (int inNdx = 0; inNdx < numInputs; inNdx++)
	{
		const ShaderInput& in = inNdx > 0 ? m_in1 : m_in0;

		if (in.inputType == INPUTTYPE_DYNAMIC && isDataTypeMatrix(in.dataType))
		{
			useAttribute(4u + inNdx, getAttributeType(in.dataType));
		}
	}

}